

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::~cmGlobalNinjaGenerator(cmGlobalNinjaGenerator *this)

{
  ~cmGlobalNinjaGenerator(this);
  operator_delete(this,0x868);
  return;
}

Assistant:

~cmGlobalNinjaGenerator() CM_OVERRIDE {}